

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O3

void string_conversion_test(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  _Alloc_hider _Var3;
  ostream *poVar4;
  size_t sVar5;
  int *piVar6;
  undefined1 trim_trailing_zeroes;
  int length;
  undefined8 in_RCX;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  int in_R8D;
  string embedded_null;
  string int_max_str;
  string int_min_str;
  string small_positive;
  string int_min_minus_1_str;
  string int_max_plus_1_str;
  string small_negative;
  shared_ptr<char> tmp2;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::locale::locale((locale *)&local_290,"en_US.UTF-8");
  std::locale::global((locale *)&local_2b0);
  std::locale::~locale((locale *)&local_2b0);
  std::locale::~locale((locale *)&local_290);
  QUtil::int_to_string_abi_cxx11_(&local_2b0,(QUtil *)0x3ebb,0,(int)in_RCX);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::int_to_string_abi_cxx11_(&local_290,(QUtil *)0x3ebb,7,(int)in_RCX);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_290._M_dataplus._M_p,local_290._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::int_to_string_abi_cxx11_(&local_270,(QUtil *)0x3ebb,0xfffffff9,(int)in_RCX);
  trim_trailing_zeroes = (undefined1)in_RCX;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_270._M_dataplus._M_p,local_270._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::double_to_string_abi_cxx11_(&local_210,(QUtil *)0x0,3.14159,0,(bool)trim_trailing_zeroes);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_210._M_dataplus._M_p,local_210._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::double_to_string_abi_cxx11_(&local_230,(QUtil *)0x3,3.14159,1,(bool)trim_trailing_zeroes);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::double_to_string_abi_cxx11_
            (&local_250,(QUtil *)0xfffffc00,1000.123,0,(bool)trim_trailing_zeroes);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::double_to_string_abi_cxx11_(&local_1f0,(QUtil *)0x5,0.1234,0,(bool)trim_trailing_zeroes);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::double_to_string_abi_cxx11_(&local_1b0,(QUtil *)0x5,0.0001234,1,(bool)trim_trailing_zeroes)
  ;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::double_to_string_abi_cxx11_(&local_1d0,(QUtil *)0x5,0.123456,1,(bool)trim_trailing_zeroes);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::double_to_string_abi_cxx11_
            (&local_50,(QUtil *)0x5,0.000123456,1,(bool)trim_trailing_zeroes);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::double_to_string_abi_cxx11_(&local_70,(QUtil *)0x5,1.0102,1,(bool)trim_trailing_zeroes);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::double_to_string_abi_cxx11_(&local_90,(QUtil *)0x5,1.0,1,(bool)trim_trailing_zeroes);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::double_to_string_abi_cxx11_(&local_b0,(QUtil *)0x5,1.0,1,(bool)trim_trailing_zeroes);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::double_to_string_abi_cxx11_(&local_d0,(QUtil *)0x5,1.0,0,(bool)trim_trailing_zeroes);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::double_to_string_abi_cxx11_(&local_f0,(QUtil *)0x2,10.0,0,(bool)trim_trailing_zeroes);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::double_to_string_abi_cxx11_(&local_110,(QUtil *)0x2,10.0,1,(bool)trim_trailing_zeroes);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_110._M_dataplus._M_p,local_110._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::int_to_string_base_abi_cxx11_(&local_130,(QUtil *)0x3ebb,10,0,in_R8D);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_130._M_dataplus._M_p,local_130._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::int_to_string_base_abi_cxx11_(&local_150,(QUtil *)0x3ebb,8,0,in_R8D);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_150._M_dataplus._M_p,local_150._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::int_to_string_base_abi_cxx11_(&local_170,(QUtil *)0x3ebb,0x10,0,in_R8D);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_170._M_dataplus._M_p,local_170._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  QUtil::int_to_string_base_abi_cxx11_(&local_190,(QUtil *)0x12a075f70,10,0,in_R8D);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_190._M_dataplus._M_p,local_190._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_2b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  local_2b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"one","");
  std::__cxx11::string::push_back((char)&local_2b0);
  std::__cxx11::string::append((char *)&local_2b0);
  _Var3._M_p = local_2b0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2fd2a8);
  }
  else {
    sVar5 = strlen(local_2b0._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_Var3._M_p,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  piVar6 = (int *)QUtil::copy_string(&local_2b0);
  bVar2 = *(int *)((long)piVar6 + 3) != *(int *)(local_2b0._M_dataplus._M_p + 3);
  pcVar8 = "compare failed";
  pcVar9 = "compare failed";
  if (!bVar2 && *piVar6 == *(int *)local_2b0._M_dataplus._M_p) {
    pcVar9 = "compare okay";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar9,
             (ulong)(bVar2 || *piVar6 != *(int *)local_2b0._M_dataplus._M_p) * 2 + 0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  if (piVar6 != (int *)0x0) {
    operator_delete__(piVar6);
  }
  QUtil::make_shared_cstr((QUtil *)&local_1b0,&local_2b0);
  pcVar9 = "compare failed";
  if (*(int *)(local_1b0._M_dataplus._M_p + 3) == *(int *)(local_2b0._M_dataplus._M_p + 3) &&
      *(int *)local_1b0._M_dataplus._M_p == *(int *)local_2b0._M_dataplus._M_p) {
    pcVar9 = "compare okay";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar9,
             (ulong)(*(int *)(local_1b0._M_dataplus._M_p + 3) !=
                     *(int *)(local_2b0._M_dataplus._M_p + 3) ||
                    *(int *)local_1b0._M_dataplus._M_p != *(int *)local_2b0._M_dataplus._M_p) * 2 +
             0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  QUtil::make_unique_cstr((QUtil *)&local_1d0,&local_2b0);
  uVar7 = (ulong)(*(int *)(local_1d0._M_dataplus._M_p + 3) !=
                  *(int *)(local_2b0._M_dataplus._M_p + 3) ||
                 *(int *)local_1d0._M_dataplus._M_p != *(int *)local_2b0._M_dataplus._M_p);
  if (*(int *)(local_1d0._M_dataplus._M_p + 3) == *(int *)(local_2b0._M_dataplus._M_p + 3) &&
      *(int *)local_1d0._M_dataplus._M_p == *(int *)local_2b0._M_dataplus._M_p) {
    pcVar8 = "compare okay";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,uVar7 * 2 + 0xc);
  length = (int)uVar7;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  QUtil::int_to_string_abi_cxx11_(&local_290,(QUtil *)0x7fffffff,0,length);
  QUtil::int_to_string_abi_cxx11_(&local_270,(QUtil *)0xffffffff80000000,0,length);
  QUtil::int_to_string_abi_cxx11_(&local_210,(QUtil *)0x80000000,0,length);
  QUtil::int_to_string_abi_cxx11_(&local_230,(QUtil *)0xffffffff7fffffff,0,length);
  QUtil::uint_to_string_abi_cxx11_(&local_250,(QUtil *)0x3ebb,0,length);
  QUtil::int_to_string_abi_cxx11_(&local_1f0,(QUtil *)0xffffffffffffc145,0,length);
  test_to_number<int>(local_270._M_dataplus._M_p,-0x80000000,false,QUtil::string_to_int);
  test_to_number<int>(local_290._M_dataplus._M_p,0x7fffffff,false,QUtil::string_to_int);
  test_to_number<int>(local_210._M_dataplus._M_p,0,true,QUtil::string_to_int);
  test_to_number<int>(local_230._M_dataplus._M_p,0,true,QUtil::string_to_int);
  test_to_number<int>("9999999999999999999999999",0,true,QUtil::string_to_int);
  test_to_number<long_long>(local_210._M_dataplus._M_p,0x80000000,false,QUtil::string_to_ll);
  test_to_number<long_long>(local_230._M_dataplus._M_p,-0x80000001,false,QUtil::string_to_ll);
  test_to_number<long_long>
            ("99999999999999999999999999999999999999999999999999",0,true,QUtil::string_to_ll);
  test_to_number<unsigned_int>(local_250._M_dataplus._M_p,0x3ebb,false,QUtil::string_to_uint);
  test_to_number<unsigned_int>(local_1f0._M_dataplus._M_p,0,true,QUtil::string_to_uint);
  test_to_number<unsigned_int>("9999999999",0,true,QUtil::string_to_uint);
  test_to_number<unsigned_long_long>(local_250._M_dataplus._M_p,0x3ebb,false,QUtil::string_to_ull);
  test_to_number<unsigned_long_long>(local_1f0._M_dataplus._M_p,0,true,QUtil::string_to_ull);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((int *)local_1d0._M_dataplus._M_p != (int *)0x0) {
    operator_delete__(local_1d0._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void
set_locale()
{
    try {
        // First try a locale known to put commas in numbers.
        std::locale::global(std::locale("en_US.UTF-8"));
    } catch (std::runtime_error&) {
        try {
            // If that fails, fall back to the user's default locale.
            std::locale::global(std::locale(""));
        } catch (std::runtime_error& e) {
            // Ignore this error on Windows without MSVC. We get
            // enough test coverage on other platforms, and mingw
            // seems to have limited locale support (as of
            // 2020-10).
#if !defined(_WIN32) || defined(_MSC_VER)
            throw e;
#endif
        }
    }
}